

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32.c
# Opt level: O3

void elf32_addrelocs(GlobalVars *gv,_func_uint8_t_Reloc_ptr *reloc_vlink2elf)

{
  node *pnVar1;
  char *pcVar2;
  uint32_t name;
  size_t sVar3;
  size_t sVar4;
  char *__s;
  uint be;
  uint32_t offset;
  uint32_t uVar5;
  LinkedSection *ls;
  Reloc *pRVar6;
  bool bVar7;
  bool bVar8;
  
  bVar7 = elf_endianess == '\x01';
  ls = (LinkedSection *)(gv->lnksec).first;
  if ((ls->n).next != (node *)0x0) {
    offset = 0;
    do {
      pRVar6 = (Reloc *)(ls->relocs).first;
      be = (uint)bVar7;
      pnVar1 = (pRVar6->n).next;
      uVar5 = offset;
      while (pnVar1 != (node *)0x0) {
        sVar3 = elf_addrela(gv,ls,pRVar6,be,reloclist,reloc_vlink2elf);
        uVar5 = uVar5 + (int)sVar3;
        pRVar6 = (Reloc *)(pRVar6->n).next;
        pnVar1 = (pRVar6->n).next;
      }
      for (pRVar6 = (Reloc *)(ls->xrefs).first; (pRVar6->n).next != (node *)0x0;
          pRVar6 = (Reloc *)(pRVar6->n).next) {
        sVar3 = elf_addrela(gv,ls,pRVar6,be,reloclist,reloc_vlink2elf);
        uVar5 = uVar5 + (int)sVar3;
      }
      if (uVar5 - offset != 0) {
        sVar4 = strlen(ls->name);
        __s = (char *)alloc(sVar4 + 6);
        pcVar2 = ".rel";
        if (gv->reloctab_format == '\x02') {
          pcVar2 = ".rela";
        }
        sprintf(__s,".%s%s",pcVar2 + 1,ls->name);
        name = elf_addshdrstr(__s);
        bVar8 = gv->reloctab_format == '\x02';
        elf32_addshdr(name,(uint)!bVar8 * 5 + 4,0,0,offset,uVar5 - offset,0,ls->index,4,
                      (uint)bVar8 * 4 + 8,(uint)bVar7);
      }
      ls = (LinkedSection *)(ls->n).next;
      offset = uVar5;
    } while ((ls->n).next != (node *)0x0);
  }
  return;
}

Assistant:

static void elf32_addrelocs(struct GlobalVars *gv,
                            uint8_t (*reloc_vlink2elf)(struct Reloc *))
/* creates relocations for all sections */
{
  bool be = elf_endianess == _BIG_ENDIAN_;
  struct LinkedSection *ls;
  struct Reloc *rel;
  uint32_t sroffs=0,roffs=0;

  for (ls=(struct LinkedSection *)gv->lnksec.first;
       ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
    sroffs = roffs;

    /* relocations */
    for (rel=(struct Reloc *)ls->relocs.first;
         rel->n.next!=NULL; rel=(struct Reloc *)rel->n.next)
      roffs += elf_addrela(gv,ls,rel,be,reloclist,reloc_vlink2elf);

    /* external references */
    for (rel=(struct Reloc *)ls->xrefs.first;
         rel->n.next!=NULL; rel=(struct Reloc *)rel->n.next)
      roffs += elf_addrela(gv,ls,rel,be,reloclist,reloc_vlink2elf);

    if (roffs != sroffs) {
      /* create ".rel(a).name" header */
      char *relname = (char *)alloc(strlen(ls->name)+6);

      sprintf(relname,".%s%s",
              gv->reloctab_format==RTAB_ADDEND ? "rela" : "rel",
              ls->name);
      elf32_addshdr(elf_addshdrstr(relname),
                    gv->reloctab_format==RTAB_ADDEND ? SHT_RELA : SHT_REL,
                    0,0,sroffs,roffs-sroffs,0,(uint32_t)ls->index,4,
                    gv->reloctab_format==RTAB_ADDEND ?
                      sizeof(struct Elf32_Rela) : sizeof(struct Elf32_Rel),
                    be);
      /* sroffs is relative and will be corrected later */
      /* sh_link will be initialized, when .symtab exists */
    }
  }
}